

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

void __thiscall sf::View::View(View *this,Vector2f *center,Vector2f *size)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = *in_RDX;
  *(undefined4 *)(in_RDI + 2) = 0;
  Rect<float>::Rect((Rect<float> *)((long)in_RDI + 0x14),0.0,0.0,1.0,1.0);
  Transform::Transform((Transform *)((long)in_RDI + 0x24));
  Transform::Transform((Transform *)((long)in_RDI + 100));
  *(undefined1 *)((long)in_RDI + 0xa4) = 0;
  *(undefined1 *)((long)in_RDI + 0xa5) = 0;
  return;
}

Assistant:

View::View(const Vector2f& center, const Vector2f& size) :
m_center             (center),
m_size               (size),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{

}